

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O0

int main(void)

{
  anon_class_1_0_00000001 local_399;
  functor_writer local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_311;
  string local_310;
  undefined1 local_2f0 [8];
  server_t s;
  
  clask::server();
  clask::logger::default_level = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"/",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"./public",&local_349);
  clask::server_t::static_dir((server_t *)local_2f0,&local_310,&local_348,false);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"/api",&local_371);
  std::function<void(clask::response_writer&,clask::request&)>::function<main::__0,void>
            ((function<void(clask::response_writer&,clask::request&)> *)&local_398,&local_399);
  clask::server_t::GET((server_t *)local_2f0,&local_370,&local_398);
  std::function<void_(clask::response_writer_&,_clask::request_&)>::~function(&local_398);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  clask::server_t::run((server_t *)local_2f0,0x1f90);
  clask::server_t::~server_t((server_t *)local_2f0);
  return 0;
}

Assistant:

int main() {
  auto s = clask::server();
  s.log.default_level = clask::log_level::INFO;
  s.static_dir("/", "./public");
  s.GET("/api", [](clask::response_writer& resp, clask::request&) {
    resp.set_header("content-type", "application/json");
    time_t t;
    struct tm* tm;
    std::time(&t);
    tm = std::gmtime(&t);
    std::stringstream date;
    date <<  R"({"time": ")"
      << std::put_time(tm, "%a, %d %B %Y %H:%M:%S GMT")
      << R"("})";
    resp.write(date.str());
    resp.end();
  });
  s.run();
}